

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BDVFile.cpp
# Opt level: O1

bool BDVFile::verifyFormat(vector<char,_std::allocator<char>_> *buf)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  string local_90;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"dd:1.3?,r?-=bb","");
  bVar1 = find_str_in_buf(&local_50,buf);
  if (bVar1) {
    bVar3 = true;
    bVar2 = false;
  }
  else {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"<<format.asc>>","");
    bVar2 = find_str_in_buf(&local_70,buf);
    if (bVar2) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"<<pins.asc>>","");
      bVar3 = find_str_in_buf(&local_90,buf);
      bVar2 = true;
    }
    else {
      bVar2 = false;
      bVar3 = false;
    }
  }
  if ((bVar2) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2)) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((!bVar1) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2)) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool BDVFile::verifyFormat(std::vector<char> &buf) {
	return find_str_in_buf("dd:1.3?,r?-=bb", buf) ||
	       (find_str_in_buf("<<format.asc>>", buf) && find_str_in_buf("<<pins.asc>>", buf));
}